

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall
QPDF::replaceReserved(QPDF *this,QPDFObjectHandle *reserved,QPDFObjectHandle *replacement)

{
  logic_error *this_00;
  QPDFObjectHandle local_50;
  QPDFObjGen local_3c;
  qpdf_object_type_e local_24;
  QPDFObjectHandle *pQStack_20;
  qpdf_object_type_e tc;
  QPDFObjectHandle *replacement_local;
  QPDFObjectHandle *reserved_local;
  QPDF *this_local;
  
  pQStack_20 = replacement;
  replacement_local = reserved;
  reserved_local = (QPDFObjectHandle *)this;
  QTC::TC("qpdf","QPDF replaceReserved",0);
  local_24 = QPDFObjectHandle::getTypeCode(reserved);
  if ((local_24 != ot_reserved) && (local_24 != ot_null)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"replaceReserved called with non-reserved object");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_3c = QPDFObjectHandle::getObjGen(reserved);
  QPDFObjectHandle::QPDFObjectHandle(&local_50,replacement);
  replaceObject(this,local_3c,&local_50);
  QPDFObjectHandle::~QPDFObjectHandle(&local_50);
  return;
}

Assistant:

void
QPDF::replaceReserved(QPDFObjectHandle reserved, QPDFObjectHandle replacement)
{
    QTC::TC("qpdf", "QPDF replaceReserved");
    auto tc = reserved.getTypeCode();
    if (!(tc == ::ot_reserved || tc == ::ot_null)) {
        throw std::logic_error("replaceReserved called with non-reserved object");
    }
    replaceObject(reserved.getObjGen(), replacement);
}